

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

char * ensureFilesExist(char *aDestination,char *aSourcePathsAndNames)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  size_t lLen;
  char *p2;
  char *p;
  char *lDestination;
  char *aSourcePathsAndNames_local;
  char *aDestination_local;
  
  if (aSourcePathsAndNames == (char *)0x0) {
    aDestination_local = (char *)0x0;
  }
  else {
    sVar2 = strlen(aSourcePathsAndNames);
    p2 = aSourcePathsAndNames;
    p = aDestination;
    if (sVar2 == 0) {
      aDestination_local = (char *)0x0;
    }
    else {
      while (pcVar3 = strchr(p2,0x7c), pcVar3 != (char *)0x0) {
        sVar2 = (long)pcVar3 - (long)p2;
        memmove(p,p2,sVar2);
        p[sVar2] = '\0';
        iVar1 = fileExists(p);
        if (iVar1 != 0) {
          p[sVar2] = '|';
          p = p + sVar2 + 1;
        }
        p2 = pcVar3 + 1;
      }
      iVar1 = fileExists(p2);
      aDestination_local = aDestination;
      if (iVar1 == 0) {
        p[-1] = '\0';
      }
      else {
        sVar2 = strlen(p2);
        memmove(p,p2,sVar2);
        p[sVar2] = '\0';
      }
    }
  }
  return aDestination_local;
}

Assistant:

static char const * ensureFilesExist(char * const aDestination,
        char const * const aSourcePathsAndNames)
{
        char * lDestination = aDestination;
        char const * p;
        char const * p2;
        size_t lLen;

        if (!aSourcePathsAndNames)
        {
                return NULL;
        }
        lLen = strlen(aSourcePathsAndNames);
        if (!lLen)
        {
                return NULL;
        }

        p = aSourcePathsAndNames;
        while ((p2 = strchr(p, '|')) != NULL)
        {
                lLen = p2 - p;
                memmove(lDestination, p, lLen);
                lDestination[lLen] = '\0';
                if (fileExists(lDestination))
                {
                        lDestination += lLen;
                        *lDestination = '|';
                        lDestination++;
                }
                p = p2 + 1;
        }
        if (fileExists(p))
        {
                lLen = strlen(p);
                memmove(lDestination, p, lLen);
                lDestination[lLen] = '\0';
        }
        else
        {
                *(lDestination - 1) = '\0';
        }
        return aDestination;
}